

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmComputeLinkInformation * __thiscall
cmGeneratorTarget::GetLinkInformation(cmGeneratorTarget *this,string *config)

{
  cmComputeLinkInformation *pcVar1;
  bool bVar2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>,_bool>
  pVar4;
  __single_object info;
  string key;
  _Head_base<0UL,_cmComputeLinkInformation_*,_false> local_50;
  undefined1 local_48 [8];
  string local_40;
  
  cmsys::SystemTools::UpperCase((string *)(local_48 + 8),config);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>_>
          ::find(&(this->LinkInformation)._M_t,(string *)(local_48 + 8));
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header) {
    local_48 = (undefined1  [8])this;
    std::make_unique<cmComputeLinkInformation,cmGeneratorTarget_const*,std::__cxx11::string_const&>
              ((cmGeneratorTarget **)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    if (local_50._M_head_impl != (cmComputeLinkInformation *)0x0) {
      bVar2 = cmComputeLinkInformation::Compute(local_50._M_head_impl);
      if (!bVar2) {
        std::
        __uniq_ptr_impl<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>::
        reset((__uniq_ptr_impl<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
               *)&local_50,(pointer)0x0);
      }
    }
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>>
            ::
            _M_emplace_unique<std::__cxx11::string&,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>>
                        *)&this->LinkInformation,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_48 + 8),
                       (unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
                        *)&local_50);
    iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
    if (*(cmComputeLinkInformation **)(iVar3._M_node + 2) != (cmComputeLinkInformation *)0x0) {
      CheckPropertyCompatibility(this,*(cmComputeLinkInformation **)(iVar3._M_node + 2),config);
    }
    std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>::
    ~unique_ptr((unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
                 *)&local_50);
  }
  pcVar1 = *(cmComputeLinkInformation **)(iVar3._M_node + 2);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  return pcVar1;
}

Assistant:

cmComputeLinkInformation* cmGeneratorTarget::GetLinkInformation(
  const std::string& config) const
{
  // Lookup any existing information for this configuration.
  std::string key(cmSystemTools::UpperCase(config));
  auto i = this->LinkInformation.find(key);
  if (i == this->LinkInformation.end()) {
    // Compute information for this configuration.
    auto info = cm::make_unique<cmComputeLinkInformation>(this, config);
    if (info && !info->Compute()) {
      info.reset();
    }

    // Store the information for this configuration.
    i = this->LinkInformation.emplace(key, std::move(info)).first;

    if (i->second) {
      this->CheckPropertyCompatibility(*i->second, config);
    }
  }
  return i->second.get();
}